

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

void xmlTextReaderStructuredRelay(void *userData,xmlError *error)

{
  char cVar1;
  xmlTextReaderPtr reader;
  
  if (*(code **)((long)userData + 0x148) != (code *)0x0) {
    (**(code **)((long)userData + 0x148))(*(undefined8 *)((long)userData + 200));
    return;
  }
  if (*(code **)((long)userData + 0xc0) != (code *)0x0) {
    if ((error->domain == 0x17) || (error->domain == 4)) {
      cVar1 = (error->level != XML_ERR_WARNING) + '\x01';
    }
    else {
      cVar1 = (error->level != XML_ERR_WARNING) + '\x03';
    }
    (**(code **)((long)userData + 0xc0))
              (*(undefined8 *)((long)userData + 200),error->message,cVar1,
               *(undefined8 *)((long)userData + 0x20));
    return;
  }
  return;
}

Assistant:

static void
xmlTextReaderStructuredRelay(void *userData, const xmlError *error)
{
    xmlTextReaderPtr reader = (xmlTextReaderPtr) userData;

    if (reader->sErrorFunc != NULL) {
        reader->sErrorFunc(reader->errorFuncArg, error);
    } else if (reader->errorFunc != NULL) {
        xmlParserSeverities severity;

        if ((error->domain == XML_FROM_VALID) ||
            (error->domain == XML_FROM_DTD)) {
            if (error->level == XML_ERR_WARNING)
                severity = XML_PARSER_SEVERITY_VALIDITY_WARNING;
            else
                severity = XML_PARSER_SEVERITY_VALIDITY_ERROR;
        } else {
            if (error->level == XML_ERR_WARNING)
                severity = XML_PARSER_SEVERITY_WARNING;
            else
                severity = XML_PARSER_SEVERITY_ERROR;
        }

        reader->errorFunc(reader->errorFuncArg, error->message, severity,
                          reader->ctxt);
    }
}